

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase1253::run(TestCase1253 *this)

{
  ulong uVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  Orphanage OVar4;
  Builder BVar5;
  Reader RVar6;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  Orphan<capnp::Data> orphan2;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  uint local_1c0;
  ListElementCount local_1bc;
  ListReader local_1b8;
  OrphanBuilder local_188;
  OrphanBuilder local_168;
  ListBuilder local_148;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  OVar4 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_1b8,OVar4.arena,OVar4.capTable,7,FOUR_BYTES);
  local_168.capTable = (CapTableBuilder *)local_1b8.ptr;
  local_168.tag.content = (uint64_t)local_1b8.segment;
  local_168.segment = (SegmentBuilder *)local_1b8.capTable;
  OrphanBuilder::asList(&local_148,&local_168,FOUR_BYTES);
  lVar2 = -7;
  uVar3 = 0;
  do {
    *(int *)(local_148.ptr + (uVar3 >> 3)) = (int)lVar2 + 0x75bcd1c;
    uVar3 = uVar3 + local_148.step;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  OVar4 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initData((OrphanBuilder *)&local_1b8,OVar4.arena,OVar4.capTable,1);
  local_188.capTable = (CapTableBuilder *)local_1b8.ptr;
  local_188.tag.content = (uint64_t)local_1b8.segment;
  local_188.segment = (SegmentBuilder *)local_1b8.capTable;
  BVar5 = OrphanBuilder::asData(&local_188);
  *BVar5.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanBuilder::truncate(&local_168,(char *)0xb,4);
  OrphanBuilder::asListReader(&local_1b8,&local_168,FOUR_BYTES);
  if ((local_1b8.elementCount != 0xb) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0xb;
    local_1bc = local_1b8.elementCount;
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4f3,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_1c0,
               &local_1bc);
  }
  uVar3 = 0x75bcd15;
  do {
    uVar1 = (ulong)local_1b8.step * (uVar3 - 0x75bcd15) >> 3;
    if ((uVar3 != *(uint *)((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar1))
       && (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = (uint)uVar3;
      local_1bc = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar1);
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f6,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1c0,
                 &local_1bc);
    }
    uVar1 = (uVar3 - 0x75bcd15) * (ulong)local_148.step >> 3;
    if ((*(int *)(local_148.ptr + uVar1) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(ListElementCount *)(local_148.ptr + uVar1);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f7,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1c0,&local_1bc)
      ;
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x75bcd1c);
  lVar2 = 7;
  do {
    uVar3 = (ulong)local_1b8.step * lVar2 >> 3;
    if ((*(int *)((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar3) != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar3);
      kj::_::Debug::log<char_const(&)[36],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4fa,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",(int *)&local_1c0,&local_1bc);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xb);
  local_148.ptr[0] = 'A';
  local_148.ptr[1] = '\x01';
  local_148.ptr[2] = '\0';
  local_148.ptr[3] = '\0';
  if ((*(int *)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader != 0x75bcd15) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x75bcd15;
    local_1bc = *(ListElementCount *)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x500,ERROR,
               "\"failed: expected \" \"(123456789) == (reader[0])\", 123456789, reader[0]",
               (char (*) [44])"failed: expected (123456789) == (reader[0])",(int *)&local_1c0,
               &local_1bc);
  }
  RVar6 = OrphanBuilder::asDataReader(&local_188);
  if ((*RVar6.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x20;
    RVar6 = OrphanBuilder::asDataReader(&local_188);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x502,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_1c0
               ,RVar6.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_188);
  }
  if (local_168.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveListCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(123456789, reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}